

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

void lj_debug_pushloc(lua_State *L,GCproto *pt,BCPos pc)

{
  uint64_t uVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  BCLine line;
  MSize len;
  MSize i;
  char *s;
  GCstr *name;
  BCPos pc_local;
  GCproto *pt_local;
  lua_State *L_local;
  
  uVar1 = (pt->chunkname).gcptr64;
  pcVar4 = (char *)(uVar1 + 0x18);
  line = *(uint *)(uVar1 + 0x14);
  uVar3 = lj_debug_line(pt,pc);
  if (pt->firstline == -1) {
    lj_strfmt_pushf(L,"builtin:%s",pcVar4);
  }
  else if (*pcVar4 == '@') {
    _len = uVar1 + 0x19;
    do {
      uVar2 = line;
      line = uVar2 - 1;
      if (line == 0) goto LAB_0010e728;
    } while ((*(char *)(_len + (ulong)(uint)line) != '/') &&
            (*(char *)(_len + (ulong)(uint)line) != '\\'));
    _len = _len + (ulong)uVar2;
LAB_0010e728:
    lj_strfmt_pushf(L,"%s:%d",_len,(ulong)uVar3);
  }
  else if ((uint)line < 0x29) {
    if (*pcVar4 == '=') {
      lj_strfmt_pushf(L,"%s:%d",uVar1 + 0x19,(ulong)uVar3);
    }
    else {
      lj_strfmt_pushf(L,"\"%s\":%d",pcVar4,(ulong)uVar3);
    }
  }
  else {
    lj_strfmt_pushf(L,"%p:%d",pt,(ulong)uVar3);
  }
  return;
}

Assistant:

void lj_debug_pushloc(lua_State *L, GCproto *pt, BCPos pc)
{
  GCstr *name = proto_chunkname(pt);
  const char *s = strdata(name);
  MSize i, len = name->len;
  BCLine line = lj_debug_line(pt, pc);
  if (pt->firstline == ~(BCLine)0) {
    lj_strfmt_pushf(L, "builtin:%s", s);
  } else if (*s == '@') {
    s++; len--;
    for (i = len; i > 0; i--)
      if (s[i] == '/' || s[i] == '\\') {
	s += i+1;
	break;
      }
    lj_strfmt_pushf(L, "%s:%d", s, line);
  } else if (len > 40) {
    lj_strfmt_pushf(L, "%p:%d", pt, line);
  } else if (*s == '=') {
    lj_strfmt_pushf(L, "%s:%d", s+1, line);
  } else {
    lj_strfmt_pushf(L, "\"%s\":%d", s, line);
  }
}